

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_csv_state.hpp
# Opt level: O1

void __thiscall duckdb::CSVGlobalState::~CSVGlobalState(CSVGlobalState *this)

{
  ~CSVGlobalState(this);
  operator_delete(this);
  return;
}

Assistant:

~CSVGlobalState() override {
	}